

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O2

void __thiscall FIX::FieldMap::addGroupPtr(FieldMap *this,int tag,FieldMap *group,bool setCount)

{
  mapped_type *this_00;
  int tag_local;
  FieldMap *group_local;
  FieldBase local_70;
  
  if (group != (FieldMap *)0x0) {
    tag_local = tag;
    group_local = group;
    this_00 = std::
              map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
              ::operator[](&this->m_groups,&tag_local);
    std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::push_back(this_00,&group_local);
    if (setCount) {
      IntField::IntField((IntField *)&local_70,tag_local,
                         (int)((ulong)((long)(this_00->
                                             super__Vector_base<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this_00->
                                            super__Vector_base<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>
                                            )._M_impl.super__Vector_impl_data._M_start) >> 3));
      setField(this,&local_70,true);
      FieldBase::~FieldBase(&local_70);
    }
  }
  return;
}

Assistant:

void FieldMap::addGroupPtr(int tag, FieldMap *group, bool setCount) {
  if (group == 0) {
    return;
  }

  std::vector<FieldMap *> &groups = m_groups[tag];
  groups.push_back(group);

  if (setCount) {
    setField(IntField(tag, (int)groups.size()));
  }
}